

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_frozen::basic_string<char>_&,_const_char_(&)[12]> * __thiscall
Catch::ExprLhs<frozen::basic_string<char>const&>::operator==
          (BinaryExpr<const_frozen::basic_string<char>_&,_const_char_(&)[12]>
           *__return_storage_ptr__,ExprLhs<frozen::basic_string<char>const&> *this,char (*rhs) [12])

{
  basic_string<char> *pbVar1;
  bool bVar2;
  StringRef local_38;
  
  bVar2 = compareEqual<frozen::basic_string<char>,char[12]>(*(basic_string<char> **)this,rhs);
  pbVar1 = *(basic_string<char> **)this;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = bVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_001c6578;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareEqual( m_lhs, rhs ), m_lhs, "==", rhs };
        }